

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mean.hpp
# Opt level: O0

float __thiscall re::math::mean<float,_1l>(math *this,span<const_float,__1L> input)

{
  index_type iVar1;
  float fVar2;
  span_iterator<gsl::span<const_float,__1L>,_false> local_38;
  span_iterator<gsl::span<const_float,__1L>,_false> local_28;
  undefined1 local_18 [8];
  span<const_float,__1L> input_local;
  
  input_local.storage_.super_extent_type<_1L> = input.storage_.super_extent_type<_1L>.size_;
  local_18 = (undefined1  [8])this;
  iVar1 = ::std::size<gsl::span<float_const,_1l>>((span<const_float,__1L> *)local_18);
  if (0 < iVar1) {
    ::std::cbegin<gsl::span<float_const,_1l>>((span<const_float,__1L> *)&local_28);
    ::std::cend<gsl::span<float_const,_1l>>((span<const_float,__1L> *)&local_38);
    fVar2 = ::std::accumulate<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,float>
                      (&local_28,&local_38,0.0);
    iVar1 = ::std::size<gsl::span<float_const,_1l>>((span<const_float,__1L> *)local_18);
    return fVar2 / (float)iVar1;
  }
  __assert_fail("std::size(input) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/mean.hpp"
                ,0x12,"T re::math::mean(gsl::span<const T, N>) [T = float, N = -1L]");
}

Assistant:

T
mean(gsl::span<T const, N> input)
noexcept
{
    assert(std::size(input) > 0);
    return std::accumulate(
        std::cbegin(input),
        std::cend(input),
        static_cast<T>(0)
    ) / std::size(input);
}